

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastBooleanAndObjectEqLikely
          (Lowerer *this,Instr *instr,Opnd *src1,Opnd *src2,LabelInstr *labelHelper,
          LabelInstr *labelEqualLikely,bool *pNeedHelper,bool isInHelper)

{
  LowererMD *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  OpndKind OVar5;
  JITTimeFunctionBody *this_01;
  LabelInstr *labelHelper_00;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  BranchInstr *pBVar8;
  uint uVar9;
  Func *func;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  *pNeedHelper = true;
  if (src2 == (Opnd *)0x0 || src1 == (Opnd *)0x0) {
    return false;
  }
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsStrictMode(this_01);
  uVar9 = instr->m_opcode - 0x14;
  if (((uVar9 < 0x2f) && ((0x600000000003U >> ((ulong)uVar9 & 0x3f) & 1) != 0)) ||
     (instr->m_opcode - 0x196 < 2)) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  local_34 = (src1->m_valueType).field_0;
  bVar4 = ValueType::IsLikelyBoolean((ValueType *)&local_34.field_0);
  if (bVar4) {
    local_32 = (src2->m_valueType).field_0;
    bVar4 = ValueType::IsLikelyBoolean((ValueType *)&local_32.field_0);
    if (bVar4) {
      if (bVar2) {
        local_34 = (src1->m_valueType).field_0;
        bVar3 = ValueType::IsBoolean((ValueType *)&local_34.field_0);
        if (bVar3) {
LAB_005ef2f8:
          *pNeedHelper = false;
          return true;
        }
        local_32 = (src2->m_valueType).field_0;
        bVar3 = ValueType::IsBoolean((ValueType *)&local_32.field_0);
        if (bVar3) goto LAB_005ef2f8;
        pRVar7 = IR::Opnd::AsRegOpnd(src2);
        LowererMD::GenerateObjectTest
                  (&this->m_lowererMD,&pRVar7->super_Opnd,instr,labelHelper,false);
        pRVar7 = IR::Opnd::AsRegOpnd(src2);
        bVar3 = GenerateJSBooleanTest(this,pRVar7,instr,labelEqualLikely,true);
        if (!bVar3) {
          return true;
        }
        func = this->m_func;
      }
      else {
        OVar5 = IR::Opnd::GetKind(src1);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar3) goto LAB_005efa88;
          *puVar6 = 0;
        }
        LowererMD::GenerateObjectTest(&this->m_lowererMD,src1,instr,labelHelper,false);
        OVar5 = IR::Opnd::GetKind(src1);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar3) goto LAB_005efa88;
          *puVar6 = 0;
        }
        GenerateJSBooleanTest(this,(RegOpnd *)src1,instr,labelHelper,false);
        OVar5 = IR::Opnd::GetKind(src2);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar3) goto LAB_005efa88;
          *puVar6 = 0;
        }
        LowererMD::GenerateObjectTest(&this->m_lowererMD,src2,instr,labelHelper,false);
        OVar5 = IR::Opnd::GetKind(src2);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar3) goto LAB_005efa88;
          *puVar6 = 0;
        }
        bVar3 = GenerateJSBooleanTest(this,(RegOpnd *)src2,instr,labelEqualLikely,true);
        if (!bVar3) {
          return true;
        }
        func = this->m_func;
      }
      pBVar8 = IR::BranchInstr::New(JMP,labelHelper,func);
      IR::Instr::InsertBefore(instr,&pBVar8->super_Instr);
      return true;
    }
  }
  local_34 = (src1->m_valueType).field_0;
  bVar4 = ValueType::HasBeenObject((ValueType *)&local_34.field_0);
  if (bVar4) {
    local_32 = (src2->m_valueType).field_0;
    bVar4 = ValueType::HasBeenObject((ValueType *)&local_32.field_0);
    if (bVar4) {
      labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,isInHelper);
      this_00 = &this->m_lowererMD;
      if (bVar2) {
        OVar5 = IR::Opnd::GetKind(src2);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_005efa88;
          *puVar6 = 0;
        }
        LowererMD::GenerateObjectTest(this_00,src2,instr,labelHelper,false);
      }
      else {
        OVar5 = IR::Opnd::GetKind(src1);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_005efa88;
          *puVar6 = 0;
        }
        LowererMD::GenerateObjectTest(this_00,src1,instr,labelHelper,false);
        OVar5 = IR::Opnd::GetKind(src2);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_005efa88;
          *puVar6 = 0;
        }
        LowererMD::GenerateObjectTest(this_00,src2,instr,labelHelper,false);
        OVar5 = IR::Opnd::GetKind(src1);
        if (OVar5 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar4) goto LAB_005efa88;
          *puVar6 = 0;
        }
        GenerateIsDynamicObject(this,(RegOpnd *)src1,instr,labelHelper_00,false);
      }
      OVar5 = IR::Opnd::GetKind(src2);
      if (OVar5 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) goto LAB_005efa88;
        *puVar6 = 0;
      }
      GenerateIsDynamicObject(this,(RegOpnd *)src2,instr,labelEqualLikely,true);
      IR::Instr::InsertBefore(instr,&labelHelper_00->super_Instr);
      if (bVar3) {
        labelHelper_00->field_0x78 = labelHelper_00->field_0x78 | 2;
        pBVar8 = IR::BranchInstr::New(JMP,labelHelper,this->m_func);
        IR::Instr::InsertBefore(instr,&pBVar8->super_Instr);
        return true;
      }
      if (!bVar2) {
        pRVar7 = IR::Opnd::AsRegOpnd(src1);
        GenerateIsBuiltinRecyclableObject
                  (this,pRVar7,instr,labelHelper,false,(LabelInstr *)0x0,isInHelper);
      }
      OVar5 = IR::Opnd::GetKind(src2);
      if (OVar5 == OpndKindReg) {
LAB_005ef9e8:
        GenerateIsBuiltinRecyclableObject
                  (this,(RegOpnd *)src2,instr,labelHelper,false,(LabelInstr *)0x0,isInHelper);
        return true;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (bVar3) {
        *puVar6 = 0;
        goto LAB_005ef9e8;
      }
      goto LAB_005efa88;
    }
  }
  local_34 = (src1->m_valueType).field_0;
  bVar3 = ValueType::IsLikelySymbol((ValueType *)&local_34.field_0);
  if (!bVar3) {
    return false;
  }
  local_32 = (src2->m_valueType).field_0;
  bVar3 = ValueType::IsLikelySymbol((ValueType *)&local_32.field_0);
  if (!bVar3) {
    return false;
  }
  OVar5 = IR::Opnd::GetKind(src1);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_005efa88;
    *puVar6 = 0;
  }
  GenerateSymbolTest(this,(RegOpnd *)src1,instr,labelHelper,(LabelInstr *)0x0,true);
  OVar5 = IR::Opnd::GetKind(src2);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_005efa88:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  GenerateSymbolTest(this,(RegOpnd *)src2,instr,labelHelper,(LabelInstr *)0x0,true);
  return true;
}

Assistant:

bool Lowerer::GenerateFastBooleanAndObjectEqLikely(IR::Instr * instr, IR::Opnd *src1, IR::Opnd *src2, IR::LabelInstr * labelHelper, IR::LabelInstr * labelEqualLikely, bool *pNeedHelper, bool isInHelper)
{
    *pNeedHelper = true;

    if (!src1 || !src2)
    {
        return false;
    }

    bool isStrictCompare = false;
    bool isStrictMode = this->m_func->GetJITFunctionBody()->IsStrictMode();

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        isStrictCompare = true;
        break;
    }

    if (src1->GetValueType().IsLikelyBoolean() && src2->GetValueType().IsLikelyBoolean())
    {
        //
        // Booleans
        //
        if (isStrictCompare)
        {
            if (!src1->GetValueType().IsBoolean() && !src2->GetValueType().IsBoolean())
            {
                this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
                if (GenerateJSBooleanTest(src2->AsRegOpnd(), instr, labelEqualLikely, true))
                {
                    instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func));
                }
            }
            else
            {
                *pNeedHelper = false;
            }
        }
        else
        {
            this->m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper, false);
            GenerateJSBooleanTest(src1->AsRegOpnd(), instr, labelHelper, false);
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
            if (GenerateJSBooleanTest(src2->AsRegOpnd(), instr, labelEqualLikely, true))
            {
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func));
            }
        }
    }
    else if (src1->GetValueType().HasBeenObject() && src2->GetValueType().HasBeenObject())
    {
        //
        // Objects
        //
        IR::LabelInstr *labelTypeIdCheck = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);

        if (!isStrictCompare)
        {
            // If not strictBr, verify both sides are dynamic objects
            this->m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper, false);
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
            GenerateIsDynamicObject(src1->AsRegOpnd(), instr, labelTypeIdCheck, false);
        }
        else
        {
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
        }
        GenerateIsDynamicObject(src2->AsRegOpnd(), instr, labelEqualLikely, true);

        instr->InsertBefore(labelTypeIdCheck);

        if (isStrictMode)
        {
            labelTypeIdCheck->isOpHelper = true;
            IR::BranchInstr *branchToHelper = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func);
            instr->InsertBefore(branchToHelper);
        }
        else
        {
            if (!ExternalLowerer::TryGenerateFastExternalEqTest(src1, src2, instr, labelHelper, labelEqualLikely, this, isStrictCompare, isInHelper))
            {
                if (!isStrictCompare)
                {
                    GenerateIsBuiltinRecyclableObject(src1->AsRegOpnd(), instr, labelHelper, false /*checkObjectAndDynamicObject*/, nullptr /*labelContinue*/, isInHelper);
                }
                GenerateIsBuiltinRecyclableObject(src2->AsRegOpnd(), instr, labelHelper, false /*checkObjectAndDynamicObject*/, nullptr /*labelContinue*/, isInHelper);
            }
        }
    }
    else if (src1->GetValueType().IsLikelySymbol() && src2->GetValueType().IsLikelySymbol())
    {
        this->GenerateSymbolTest(src1->AsRegOpnd(), instr, labelHelper, nullptr, true);
        this->GenerateSymbolTest(src2->AsRegOpnd(), instr, labelHelper, nullptr, true);
    }
    else
    {
        return false;
    }

    return true;
}